

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source.cc
# Opt level: O0

PSprite __thiscall SpriteBase::get_masked(SpriteBase *this,PSprite *mask)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  int iVar5;
  int iVar6;
  element_type *peVar7;
  undefined4 extraout_var;
  ExceptionFreeserf *this_00;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  __shared_ptr_access<Data::Sprite,_(__gnu_cxx::_Lock_policy)2,_false,_false> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  PSprite PVar8;
  ulong local_a8;
  size_t x;
  size_t y;
  uint32_t *m_pos;
  size_t s_delta;
  uint32_t *s_end;
  uint32_t *s_pos;
  uint32_t *s_beg;
  uint32_t *pos;
  undefined1 local_56;
  undefined1 local_55;
  allocator<char> local_41;
  string local_40;
  PSprite *mask_local;
  SpriteBase *this_local;
  PSprite *masked;
  
  mask_local = mask;
  this_local = this;
  peVar7 = std::__shared_ptr_access<Data::Sprite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(in_RDX);
  iVar5 = (*peVar7->_vptr_Sprite[1])();
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(extraout_var,iVar5) <=
      mask[2].super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi) {
    local_56 = 0;
    std::make_shared<SpriteBase,std::shared_ptr<Data::Sprite>&>((shared_ptr<Data::Sprite> *)&pos);
    std::shared_ptr<Data::Sprite>::shared_ptr<SpriteBase,void>
              ((shared_ptr<Data::Sprite> *)this,(shared_ptr<SpriteBase> *)&pos);
    std::shared_ptr<SpriteBase>::~shared_ptr((shared_ptr<SpriteBase> *)&pos);
    peVar7 = std::__shared_ptr_access<Data::Sprite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Data::Sprite,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    iVar5 = (**peVar7->_vptr_Sprite)();
    s_beg = (uint32_t *)CONCAT44(extraout_var_00,iVar5);
    p_Var1 = mask[3].super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    p_Var2 = mask[2].super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    peVar3 = mask[3].super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var4 = mask[2].super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    peVar7 = std::__shared_ptr_access<Data::Sprite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Data::Sprite,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    iVar5 = (*peVar7->_vptr_Sprite[1])();
    peVar7 = std::__shared_ptr_access<Data::Sprite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(in_RDX);
    iVar6 = (**peVar7->_vptr_Sprite)();
    y = CONCAT44(extraout_var_02,iVar6);
    x = 0;
    s_end = (uint32_t *)p_Var1;
    while( true ) {
      peVar7 = std::__shared_ptr_access<Data::Sprite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Data::Sprite,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      iVar6 = (*peVar7->_vptr_Sprite[2])();
      if (CONCAT44(extraout_var_03,iVar6) <= x) break;
      local_a8 = 0;
      while( true ) {
        peVar7 = std::__shared_ptr_access<Data::Sprite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Data::Sprite,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
        iVar6 = (*peVar7->_vptr_Sprite[1])();
        if (CONCAT44(extraout_var_04,iVar6) <= local_a8) break;
        if ((uint32_t *)((long)&p_Var1->_vptr__Sp_counted_base + (long)p_Var2 * (long)peVar3 * 4) <=
            s_end) {
          s_end = (uint32_t *)p_Var1;
        }
        *s_beg = *s_end & *(uint *)y;
        local_a8 = local_a8 + 1;
        y = y + 4;
        s_end = s_end + 1;
        s_beg = s_beg + 1;
      }
      s_end = s_end + ((long)p_Var4 - CONCAT44(extraout_var_01,iVar5));
      x = x + 1;
    }
    PVar8.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    PVar8.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_ptr = &this->super_Sprite;
    return (PSprite)PVar8.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>;
  }
  local_55 = 1;
  this_00 = (ExceptionFreeserf *)__cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"Failed to apply mask to sprite",&local_41);
  ExceptionFreeserf::ExceptionFreeserf(this_00,&local_40);
  local_55 = 0;
  __cxa_throw(this_00,&ExceptionFreeserf::typeinfo,ExceptionFreeserf::~ExceptionFreeserf);
}

Assistant:

Data::PSprite
SpriteBase::get_masked(Data::PSprite mask) {
  if (mask->get_width() > width) {
    throw ExceptionFreeserf("Failed to apply mask to sprite");
  }

  Data::PSprite masked = std::make_shared<SpriteBase>(mask);

  uint32_t *pos = reinterpret_cast<uint32_t*>(masked->get_data());

  uint32_t *s_beg = reinterpret_cast<uint32_t*>(data);
  uint32_t *s_pos = s_beg;
  uint32_t *s_end = s_beg + (width * height);
  size_t s_delta = width - masked->get_width();

  uint32_t *m_pos = reinterpret_cast<uint32_t*>(mask->get_data());

  for (size_t y = 0; y < masked->get_height(); y++) {
    for (size_t x = 0; x < masked->get_width(); x++) {
      if (s_pos >= s_end) {
        s_pos = s_beg;
      }
      *pos++ = *s_pos++ & *m_pos++;
    }
    s_pos += s_delta;
  }

  return masked;
}